

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O0

bool __thiscall
Inferences::ChoiceDefinitionISE::is_of_form_xfx
          (ChoiceDefinitionISE *this,Literal *lit,TermList x,TermList *f)

{
  bool bVar1;
  TermList *pTVar2;
  size_t sVar3;
  Term *in_RSI;
  TermList arg;
  TermList head;
  TermStack args;
  TermList term;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  TermList *in_stack_ffffffffffffff38;
  TermList in_stack_ffffffffffffff40;
  bool local_b2;
  TermList *local_98;
  TermList local_60;
  Stack<Kernel::TermList> local_58;
  uint64_t local_38;
  uint64_t local_30;
  Term *local_20;
  TermList local_10;
  bool local_1;
  
  local_20 = in_RSI;
  pTVar2 = Kernel::Term::nthArgument(in_RSI,0);
  local_38 = pTVar2->_content;
  bVar1 = ApplicativeHelper::isBool(in_stack_ffffffffffffff40);
  if (bVar1) {
    local_98 = Kernel::Term::nthArgument(local_20,1);
  }
  else {
    local_98 = Kernel::Term::nthArgument(local_20,0);
  }
  local_30 = local_98->_content;
  Lib::Stack<Kernel::TermList>::Stack
            ((Stack<Kernel::TermList> *)in_stack_ffffffffffffff40._content,
             (size_t)in_stack_ffffffffffffff38);
  Kernel::TermList::TermList(&local_60);
  ApplicativeHelper::getHeadAndArgs
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             (TermStack *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  bVar1 = Kernel::TermList::operator==(&local_60,&local_10);
  if ((bVar1) && (sVar3 = Lib::Stack<Kernel::TermList>::size(&local_58), sVar3 == 1)) {
    Lib::Stack<Kernel::TermList>::operator[](&local_58,0);
    ApplicativeHelper::getHeadAndArgs
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (TermStack *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    bVar1 = Kernel::TermList::isVar
                      ((TermList *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    local_b2 = false;
    if (!bVar1) {
      sVar3 = Lib::Stack<Kernel::TermList>::size(&local_58);
      local_b2 = false;
      if (sVar3 == 1) {
        pTVar2 = Lib::Stack<Kernel::TermList>::operator[](&local_58,0);
        in_stack_ffffffffffffff37 = Kernel::TermList::operator==(pTVar2,&local_10);
        local_b2 = (bool)in_stack_ffffffffffffff37;
      }
    }
    local_1 = local_b2;
  }
  else {
    local_1 = false;
  }
  Lib::Stack<Kernel::TermList>::~Stack
            ((Stack<Kernel::TermList> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  return (bool)(local_1 & 1);
}

Assistant:

bool ChoiceDefinitionISE::is_of_form_xfx(Literal* lit, TermList x, TermList& f){
  TermList term = AH::isBool(*lit->nthArgument(0)) ? *lit->nthArgument(1) : *lit->nthArgument(0);
  
  TermStack args;
  TermList head;
  ApplicativeHelper::getHeadAndArgs(term, head, args);
  if(head == x && args.size() == 1){
    TermList arg = args[0];
    ApplicativeHelper::getHeadAndArgs(arg, f, args);
    return (!f.isVar() && args.size() == 1 && args[0] == x);
  }
  return false;
}